

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_Brep::Read(ON_Brep *this,ON_BinaryArchive *file)

{
  ON_BoundingBox archive_bbox;
  ON_BoundingBox archive_bbox_00;
  ON_BoundingBox new_bbox;
  ON_BoundingBox new_bbox_00;
  ON_Interval domain;
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  ON_BrepEdge *this_00;
  ON_Curve **ppOVar5;
  ON_BrepTrim *this_01;
  ON_BrepLoop *pOVar6;
  ON_Surface **ppOVar7;
  ON_BrepRegionTopology *this_02;
  ON_BrepFace *pOVar8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  ON_Interval OVar9;
  ON_Interval OVar10;
  ON_BrepRegionTopology *in_stack_fffffffffffffc78;
  double local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 local_2f0 [8];
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [48];
  double local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined1 local_260 [8];
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined1 local_230 [48];
  undefined1 local_200 [8];
  ON_BoundingBox new_face_bbox;
  ON_BoundingBox archive_face_bbox;
  ON_BrepFace *f_1;
  uint fi_1;
  uint face_count_1;
  ON_BoundingBox new_brep_bbox;
  ON_BoundingBox archive_brep_bbox;
  bool local_11e;
  byte local_11d;
  int local_11c;
  bool bReadRegionTopology;
  bool rc1;
  ON_Mesh *pOStack_118;
  int region_topology_chunk_version;
  ON_Mesh *pMesh_1;
  ON_Mesh *pMesh;
  ON__UINT8 local_fd;
  int face_count;
  uchar b;
  ON__INT64 OStack_f8;
  int fi;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  ON_Object *pOStack_e8;
  ON__UINT32 tcode;
  ON_Object *obj;
  ON_BrepFace *f;
  double local_d0;
  double local_c8;
  double local_c0;
  ON_BrepFace *local_b8;
  ON_Interval tdom;
  ON_Interval pdom_1;
  bool bProxyCurveIsReversed_1;
  ON_BrepTrim *trim;
  ON_Interval edom;
  ON_Interval pdom;
  bool bProxyCurveIsReversed;
  ON_BrepEdge *e;
  int local_30;
  int iStack_2c;
  bool rc;
  int minor_version;
  int major_version;
  int S_count;
  int C3_count;
  int C2_count;
  int i;
  ON_BinaryArchive *file_local;
  ON_Brep *this_local;
  
  S_count = 0;
  major_version = 0;
  minor_version = 0;
  iStack_2c = 0;
  local_30 = 0;
  _C2_count = file;
  file_local = (ON_BinaryArchive *)this;
  e._7_1_ = ON_BinaryArchive::Read3dmChunkVersion(file,&stack0xffffffffffffffd4,&local_30);
  if ((e._7_1_) && (iStack_2c == 2)) {
    e._7_1_ = ReadOld200(this,_C2_count,local_30);
    goto LAB_0055aff7;
  }
  if ((!e._7_1_) || (iStack_2c != 3)) goto LAB_0055aff7;
  if (e._7_1_) {
    e._7_1_ = ON_CurveArray::Read(&this->m_C2,_C2_count);
  }
  S_count = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>);
  if (e._7_1_ != false) {
    e._7_1_ = ON_CurveArray::Read(&this->m_C3,_C2_count);
  }
  major_version = ON_SimpleArray<ON_Curve_*>::Count(&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>);
  if (e._7_1_ != false) {
    e._7_1_ = ON_SurfaceArray::Read(&this->m_S,_C2_count);
  }
  minor_version =
       ON_SimpleArray<ON_Surface_*>::Count(&(this->m_S).super_ON_SimpleArray<ON_Surface_*>);
  if (e._7_1_ != false) {
    e._7_1_ = ON_BrepVertexArray::Read(&this->m_V,_C2_count);
  }
  if ((e._7_1_ != false) && (e._7_1_ = ON_BrepEdgeArray::Read(&this->m_E,_C2_count), e._7_1_)) {
    for (C3_count = 0; iVar4 = C3_count,
        iVar2 = ON_ClassArray<ON_BrepEdge>::Count((ON_ClassArray<ON_BrepEdge> *)&this->m_E),
        iVar4 < iVar2; C3_count = C3_count + 1) {
      this_00 = ON_ClassArray<ON_BrepEdge>::operator[]
                          ((ON_ClassArray<ON_BrepEdge> *)&this->m_E,C3_count);
      this_00->m_brep = this;
      if ((-1 < this_00->m_c3i) && (this_00->m_c3i < major_version)) {
        bVar1 = ON_CurveProxy::ProxyCurveIsReversed(&this_00->super_ON_CurveProxy);
        OVar9 = ON_CurveProxy::ProxyCurveDomain(&this_00->super_ON_CurveProxy);
        OVar9.m_t[1]._0_4_ = OVar9.m_t[1]._0_4_;
        OVar9.m_t[1]._4_4_ = OVar9.m_t[1]._4_4_;
        (*(this_00->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])();
        OVar10.m_t[0]._4_4_ = extraout_XMM0_Db;
        OVar10.m_t[0]._0_4_ = extraout_XMM0_Da;
        OVar10.m_t[1]._4_4_ = OVar9.m_t[1]._4_4_;
        OVar10.m_t[1]._0_4_ = OVar9.m_t[1]._0_4_;
        ppOVar5 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_C3).super_ON_SimpleArray<ON_Curve_*>,this_00->m_c3i);
        ON_CurveProxy::SetProxyCurve(&this_00->super_ON_CurveProxy,*ppOVar5,OVar9);
        if (bVar1) {
          ON_CurveProxy::Reverse(&this_00->super_ON_CurveProxy);
        }
        ON_CurveProxy::SetDomain(&this_00->super_ON_CurveProxy,OVar10);
      }
    }
  }
  if ((e._7_1_ != false) && (e._7_1_ = ON_BrepTrimArray::Read(&this->m_T,_C2_count), e._7_1_)) {
    for (C3_count = 0; iVar4 = C3_count,
        iVar2 = ON_ClassArray<ON_BrepTrim>::Count((ON_ClassArray<ON_BrepTrim> *)&this->m_T),
        iVar4 < iVar2; C3_count = C3_count + 1) {
      this_01 = ON_ClassArray<ON_BrepTrim>::operator[]
                          ((ON_ClassArray<ON_BrepTrim> *)&this->m_T,C3_count);
      this_01->m_brep = this;
      if ((-1 < this_01->m_c2i) && (this_01->m_c2i < S_count)) {
        bVar1 = ON_CurveProxy::ProxyCurveIsReversed(&this_01->super_ON_CurveProxy);
        OVar10 = ON_CurveProxy::ProxyCurveDomain(&this_01->super_ON_CurveProxy);
        OVar9.m_t[1]._0_4_ = OVar10.m_t[1]._0_4_;
        OVar9.m_t[1]._4_4_ = OVar10.m_t[1]._4_4_;
        tdom.m_t[1] = OVar10.m_t[0];
        (*(this_01->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object.
          _vptr_ON_Object[0x25])();
        local_b8 = (ON_BrepFace *)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
        tdom.m_t[0] = (double)CONCAT44(OVar9.m_t[1]._4_4_,OVar9.m_t[1]._0_4_);
        ppOVar5 = ON_SimpleArray<ON_Curve_*>::operator[]
                            (&(this->m_C2).super_ON_SimpleArray<ON_Curve_*>,this_01->m_c2i);
        local_c8 = tdom.m_t[1];
        OVar9.m_t[1] = OVar10.m_t[1];
        OVar9.m_t[0] = tdom.m_t[1];
        local_c0 = OVar10.m_t[1];
        ON_CurveProxy::SetProxyCurve(&this_01->super_ON_CurveProxy,*ppOVar5,OVar9);
        if (bVar1) {
          ON_CurveProxy::Reverse(&this_01->super_ON_CurveProxy);
        }
        f = local_b8;
        local_d0 = tdom.m_t[0];
        domain.m_t[1] = tdom.m_t[0];
        domain.m_t[0] = (double)local_b8;
        ON_CurveProxy::SetDomain(&this_01->super_ON_CurveProxy,domain);
      }
    }
  }
  if ((e._7_1_ != false) && (e._7_1_ = ON_BrepLoopArray::Read(&this->m_L,_C2_count), e._7_1_)) {
    for (C3_count = 0; iVar4 = C3_count,
        iVar2 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L),
        iVar4 < iVar2; C3_count = C3_count + 1) {
      pOVar6 = ON_ClassArray<ON_BrepLoop>::operator[]
                         ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,C3_count);
      pOVar6->m_brep = this;
    }
  }
  if ((e._7_1_ != false) && (e._7_1_ = ON_BrepFaceArray::Read(&this->m_F,_C2_count), e._7_1_)) {
    for (C3_count = 0; iVar4 = C3_count,
        iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F),
        iVar4 < iVar2; C3_count = C3_count + 1) {
      pOVar8 = ON_ClassArray<ON_BrepFace>::operator[]
                         ((ON_ClassArray<ON_BrepFace> *)&this->m_F,C3_count);
      pOVar8->m_brep = this;
      obj = (ON_Object *)pOVar8;
      if ((-1 < pOVar8->m_si) && (pOVar8->m_si < minor_version)) {
        ppOVar7 = ON_SimpleArray<ON_Surface_*>::operator[]
                            (&(this->m_S).super_ON_SimpleArray<ON_Surface_*>,pOVar8->m_si);
        ON_SurfaceProxy::SetProxySurface(&pOVar8->super_ON_SurfaceProxy,*ppOVar7);
      }
    }
  }
  if (e._7_1_ != false) {
    e._7_1_ = ON_BinaryArchive::ReadPoint(_C2_count,&(this->m_bbox).m_min);
  }
  if (e._7_1_ != false) {
    e._7_1_ = ON_BinaryArchive::ReadPoint(_C2_count,&(this->m_bbox).m_max);
  }
  ReadFillInMissingBoxes(this);
  if ((e._7_1_ != false) && (0 < local_30)) {
    length_TCODE_ANONYMOUS_CHUNK._4_4_ = 0;
    OStack_f8 = 0;
    pMesh._4_4_ = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
    length_TCODE_ANONYMOUS_CHUNK._4_4_ = 0;
    OStack_f8 = 0;
    e._7_1_ = ON_BinaryArchive::BeginRead3dmBigChunk
                        (_C2_count,(uint *)((long)&length_TCODE_ANONYMOUS_CHUNK + 4),
                         &stack0xffffffffffffff08);
    if (e._7_1_) {
      if (length_TCODE_ANONYMOUS_CHUNK._4_4_ == 0x40008000) {
        for (face_count = 0; e._7_1_ != false && face_count < pMesh._4_4_;
            face_count = face_count + 1) {
          e._7_1_ = ON_BinaryArchive::ReadChar(_C2_count,&local_fd);
          if ((e._7_1_) && (local_fd != '\0')) {
            pOStack_e8 = (ON_Object *)0x0;
            iVar4 = ON_BinaryArchive::ReadObject(_C2_count,&stack0xffffffffffffff18);
            e._7_1_ = iVar4 != 0;
            if (pOStack_e8 != (ON_Object *)0x0) {
              pMesh_1 = ON_Mesh::Cast(pOStack_e8);
              if (pMesh_1 == (ON_Mesh *)0x0) {
                if (pOStack_e8 != (ON_Object *)0x0) {
                  (*pOStack_e8->_vptr_ON_Object[4])();
                }
              }
              else {
                pOVar8 = ON_ClassArray<ON_BrepFace>::operator[]
                                   ((ON_ClassArray<ON_BrepFace> *)&this->m_F,face_count);
                ON_BrepFace::SetMesh(pOVar8,render_mesh,pMesh_1);
              }
            }
          }
        }
      }
      else {
        e._7_1_ = false;
      }
      bVar1 = ON_BinaryArchive::EndRead3dmChunk(_C2_count);
      if (!bVar1) {
        e._7_1_ = false;
      }
    }
    if (e._7_1_ != false) {
      length_TCODE_ANONYMOUS_CHUNK._4_4_ = 0;
      OStack_f8 = 0;
      e._7_1_ = ON_BinaryArchive::BeginRead3dmBigChunk
                          (_C2_count,(uint *)((long)&length_TCODE_ANONYMOUS_CHUNK + 4),
                           &stack0xffffffffffffff08);
      if (e._7_1_) {
        if (length_TCODE_ANONYMOUS_CHUNK._4_4_ == 0x40008000) {
          for (face_count = 0; e._7_1_ != false && face_count < pMesh._4_4_;
              face_count = face_count + 1) {
            e._7_1_ = ON_BinaryArchive::ReadChar(_C2_count,&local_fd);
            if ((e._7_1_) && (local_fd != '\0')) {
              iVar4 = ON_BinaryArchive::ReadObject(_C2_count,&stack0xffffffffffffff18);
              e._7_1_ = iVar4 != 0;
              if (pOStack_e8 != (ON_Object *)0x0) {
                pOStack_118 = ON_Mesh::Cast(pOStack_e8);
                if (pOStack_118 == (ON_Mesh *)0x0) {
                  if (pOStack_e8 != (ON_Object *)0x0) {
                    (*pOStack_e8->_vptr_ON_Object[4])();
                  }
                }
                else {
                  pOVar8 = ON_ClassArray<ON_BrepFace>::operator[]
                                     ((ON_ClassArray<ON_BrepFace> *)&this->m_F,face_count);
                  ON_BrepFace::SetMesh(pOVar8,analysis_mesh,pOStack_118);
                }
              }
            }
          }
        }
        else {
          e._7_1_ = false;
        }
        bVar1 = ON_BinaryArchive::EndRead3dmChunk(_C2_count);
        if (!bVar1) {
          e._7_1_ = false;
        }
      }
    }
  }
  if ((e._7_1_ == false) || (local_30 < 2)) goto LAB_0055aff7;
  e._7_1_ = ON_BinaryArchive::ReadInt(_C2_count,&this->m_is_solid);
  if ((this->m_is_solid < 0) || (2 < this->m_is_solid)) {
    this->m_is_solid = 0;
  }
  if ((!e._7_1_) || (local_30 < 3)) goto LAB_0055aff7;
  local_11c = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmAnonymousChunk(_C2_count,&local_11c);
  if (!bVar1) {
    e._7_1_ = false;
    goto LAB_0055aff7;
  }
  local_11d = 0;
  if (0 < local_11c) {
    local_11e = false;
    bVar1 = ON_BinaryArchive::ReadBool(_C2_count,&local_11e);
    if (bVar1) {
      if ((local_11e & 1U) != 0) {
        this_02 = (ON_BrepRegionTopology *)operator_new(0x38);
        ON_BrepRegionTopology::ON_BrepRegionTopology(this_02);
        this->m_region_topology = this_02;
        bVar1 = ON_BrepRegionTopology::Read(this->m_region_topology,_C2_count);
        if (!bVar1) {
          in_stack_fffffffffffffc78 = this->m_region_topology;
          if (in_stack_fffffffffffffc78 != (ON_BrepRegionTopology *)0x0) {
            ON_BrepRegionTopology::~ON_BrepRegionTopology(in_stack_fffffffffffffc78);
            operator_delete(in_stack_fffffffffffffc78,0x38);
          }
          this->m_region_topology = (ON_BrepRegionTopology *)0x0;
          goto LAB_0055afc4;
        }
      }
      local_11d = 1;
    }
  }
LAB_0055afc4:
  bVar1 = ON_BinaryArchive::EndRead3dmChunk(_C2_count);
  if (!bVar1) {
    local_11d = 0;
  }
  if ((local_11d & 1) == 0) {
    e._7_1_ = false;
  }
LAB_0055aff7:
  uVar3 = ON_BinaryArchive::ArchiveOpenNURBSVersion(_C2_count);
  if (uVar3 < 0x1317f0a) {
    this->m_is_solid = 0;
  }
  iVar4 = ON_BinaryArchive::Archive3dmVersion(_C2_count);
  if ((iVar4 < 0x5a) && (bVar1 = ON_BoundingBox::IsNotEmpty(&this->m_bbox), bVar1)) {
    memcpy(&new_brep_bbox.m_max.z,&this->m_bbox,0x30);
    memcpy(&fi_1,&ON_BoundingBox::EmptyBoundingBox,0x30);
    uVar3 = ON_ClassArray<ON_BrepFace>::UnsignedCount((ON_ClassArray<ON_BrepFace> *)&this->m_F);
    for (f_1._0_4_ = 0; (uint)f_1 < uVar3; f_1._0_4_ = (uint)f_1 + 1) {
      pOVar8 = ON_ClassArray<ON_BrepFace>::operator[]
                         ((ON_ClassArray<ON_BrepFace> *)&this->m_F,(uint)f_1);
      memcpy(&new_face_bbox.m_max.z,&pOVar8->m_bbox,0x30);
      ON_BrepFace::InternalFaceBoundingBox((ON_BoundingBox *)local_200,pOVar8,false,false);
      memcpy(local_260,&new_face_bbox.m_max.z,0x30);
      memcpy(&local_290,local_200,0x30);
      archive_bbox.m_min.y = (double)local_250;
      archive_bbox.m_min.x = (double)uStack_258;
      archive_bbox.m_min.z = (double)uStack_248;
      archive_bbox.m_max.x = (double)local_240;
      archive_bbox.m_max.y = (double)uStack_238;
      archive_bbox.m_max.z = local_290;
      new_bbox.m_min.y = (double)local_280;
      new_bbox.m_min.x = (double)uStack_288;
      new_bbox.m_min.z = (double)uStack_278;
      new_bbox.m_max.x = (double)local_270;
      new_bbox.m_max.y = (double)uStack_268;
      new_bbox.m_max.z = (double)in_stack_fffffffffffffc78;
      Internal_BestBoundingBox(archive_bbox,new_bbox);
      memcpy(&pOVar8->m_bbox,local_230,0x30);
      ON_BoundingBox::Union((ON_BoundingBox *)&fi_1,&pOVar8->m_bbox);
    }
    memcpy(local_2f0,&new_brep_bbox.m_max.z,0x30);
    memcpy(&local_320,&fi_1,0x30);
    archive_bbox_00.m_min.y = (double)local_2e0;
    archive_bbox_00.m_min.x = (double)uStack_2e8;
    archive_bbox_00.m_min.z = (double)uStack_2d8;
    archive_bbox_00.m_max.x = (double)local_2d0;
    archive_bbox_00.m_max.y = (double)uStack_2c8;
    archive_bbox_00.m_max.z = local_320;
    new_bbox_00.m_min.y = (double)local_310;
    new_bbox_00.m_min.x = (double)uStack_318;
    new_bbox_00.m_min.z = (double)uStack_308;
    new_bbox_00.m_max.x = (double)local_300;
    new_bbox_00.m_max.y = (double)uStack_2f8;
    new_bbox_00.m_max.z = (double)in_stack_fffffffffffffc78;
    Internal_BestBoundingBox(archive_bbox_00,new_bbox_00);
    memcpy(&this->m_bbox,local_2c0,0x30);
  }
  return e._7_1_;
}

Assistant:

bool ON_Brep::Read( ON_BinaryArchive& file )
{
  int i;
  int C2_count = 0;
  int C3_count = 0;
  int S_count = 0;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion( &major_version, &minor_version );
  if ( rc && major_version == 2 ) 
  {
    rc = ReadOld200(file,minor_version); // legacy trimmed face
  }
  else if ( rc && major_version == 3 ) 
  {
    // 2d curves
    if (rc) 
      rc = m_C2.Read(file);
    C2_count = m_C2.Count();

    // 3d curves
    if (rc) 
      rc = m_C3.Read(file);
    C3_count = m_C3.Count();

    // untrimmed surfaces
    if (rc) 
      rc = m_S.Read(file);
    S_count = m_S.Count();

    // vertices
    if (rc) 
      rc = m_V.Read(file);

    // edges
    if (rc) 
    {
      rc = m_E.Read(file);
      if (rc) {
        for ( i = 0; i < m_E.Count(); i++ ) {
          ON_BrepEdge& e = m_E[i];
          e.m_brep = this;
          if ( e.m_c3i >= 0 && e.m_c3i < C3_count )
          {
            bool bProxyCurveIsReversed = e.ProxyCurveIsReversed();
            ON_Interval pdom = e.ProxyCurveDomain();
            ON_Interval edom = e.Domain();
            e.SetProxyCurve( m_C3[e.m_c3i], pdom );
            if ( bProxyCurveIsReversed )
              e.ON_CurveProxy::Reverse();
            e.SetDomain(edom);
          }
        }
      }
    }

    // trims
    if (rc) 
    {
      rc = m_T.Read(file);
      if (rc) {
        for ( i = 0; i < m_T.Count(); i++ ) {
          ON_BrepTrim& trim = m_T[i];
          trim.m_brep = this;
          if ( trim.m_c2i >= 0 && trim.m_c2i < C2_count )
          {
            bool bProxyCurveIsReversed = trim.ProxyCurveIsReversed();
            ON_Interval pdom = trim.ProxyCurveDomain();
            ON_Interval tdom = trim.Domain();
            trim.SetProxyCurve( m_C2[trim.m_c2i], pdom );
            if ( bProxyCurveIsReversed )
              trim.ON_CurveProxy::Reverse();
            trim.SetDomain(tdom);
          }
        }
      }
    }

    // loops
    if (rc) 
    {
      rc = m_L.Read(file);
      if ( rc )
      {
        for ( i = 0; i < m_L.Count(); i++ ) 
        {
          m_L[i].m_brep = this;
        }
      }
    }

    // faces
    if (rc) 
    {
      rc = m_F.Read(file);
      if (rc) {
        for ( i = 0; i < m_F.Count(); i++ ) {
          ON_BrepFace& f = m_F[i];
          f.m_brep = this;
          if ( f.m_si >= 0 && f.m_si < S_count )
            f.SetProxySurface(m_S[f.m_si]);
        }
      }
    }

    // bounding box
    if (rc) 
      rc = file.ReadPoint( m_bbox.m_min );
    if (rc) 
      rc = file.ReadPoint( m_bbox.m_max );

    // fill in missing information
    ReadFillInMissingBoxes(*this);

    // end of chunk version 3.0

    if (rc && minor_version >= 1 )
    {
      // added for chunk version 3.1

      ON_Object* obj;
      ON__UINT32 tcode = 0;
      ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
      int fi;
      unsigned char b;

      const int face_count = m_F.Count();

      // read render meshes
      tcode = 0;
      length_TCODE_ANONYMOUS_CHUNK = 0;
      rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
      if ( rc )
      {
        if ( tcode != TCODE_ANONYMOUS_CHUNK )
          rc = false;
        else
        {
          for ( fi = 0; rc && fi < face_count; fi++ ) 
          {
            rc = file.ReadChar(&b);
            if (rc && b) 
            {
              obj = 0;
              rc = file.ReadObject(&obj);
              if ( 0 != obj )
              {
                auto pMesh = ON_Mesh::Cast(obj);
                if (nullptr == pMesh)
                {
                  delete obj;
                }
                else
                {
                  m_F[fi].SetMesh(ON::render_mesh, pMesh);
                }
              }
            }
          }
        }
        if ( !file.EndRead3dmChunk() )
          rc = false;
      }

      if (rc)
      {
        // read analysis meshes
        tcode = 0;
        length_TCODE_ANONYMOUS_CHUNK = 0;
        rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
        if ( rc )
        {
          if ( tcode != TCODE_ANONYMOUS_CHUNK )
            rc = false;
          else
          {
            for ( fi = 0; rc && fi < face_count; fi++ ) 
            {
              rc = file.ReadChar(&b);
              if (rc && b) 
              {
                rc = file.ReadObject(&obj);
                
                if (nullptr != obj)
                {
                  auto pMesh = ON_Mesh::Cast(obj);
                  if (nullptr == pMesh)
                  {
                    delete obj;
                  }
                  else
                  {
                    m_F[fi].SetMesh(ON::analysis_mesh, pMesh);
                  }
                }
              }
            }
          }
          if ( !file.EndRead3dmChunk() )
            rc = false;
        }
      }
    }

    if ( rc && minor_version >= 2 )
    {
      rc =  file.ReadInt( &m_is_solid );
      if ( m_is_solid < 0 || m_is_solid >= 3 )
        m_is_solid = 0;
      if (rc && minor_version >= 3)
      {
        // begin chunk verson 3.3

        // region topology chunk added
        int region_topology_chunk_version = 0;
        if (!file.BeginRead3dmAnonymousChunk(&region_topology_chunk_version))
          rc = false;
        else
        {
          bool rc1 = false;
          for (;;)
          {
            if (region_topology_chunk_version < 1)
              break;

            bool bReadRegionTopology = false;
            if (!file.ReadBool(&bReadRegionTopology))
              break;

            if (bReadRegionTopology)
            {
              m_region_topology = new ON_BrepRegionTopology();
              if (!m_region_topology->Read(file))
              {
                delete m_region_topology;
                m_region_topology = nullptr;
                break;
              }
            }
            rc1 = true;
            break;
          }
          if (!file.EndRead3dmChunk())
            rc1 = false;
          if (false == rc1)
            rc = false;
        }
      }
    }
  }

  if ( file.ArchiveOpenNURBSVersion() < 20021002 )
  {
    m_is_solid = 0;
  }

  // GBA 3-Sept-20 RH-60112
  // In V6 and earlier bounding boxes of faces were bounding box of underlying surface.
  // This can result in enourmous boxes which mess up make2d
  // In V7 bounding boxes use the trim pbox resulting in resonable boxes.
  ////if (file.Archive3dmVersion() < 70 || file.ArchiveOpenNURBSVersion() < 2382395020)
  ////{
  ////  if (!m_bbox.IsEmpty())
  ////  {
  ////    ON_BoundingBox orig_box = m_bbox;
  ////    ClearBoundingBox();
  ////    BoundingBox();                    // compute bounding box
  ////    m_bbox.Intersection(orig_box);
  ////  }
  ////}

  // Dale Lear https://mcneel.myjetbrains.com/youtrack/issue/RH-64277
  // The test used to fix RH-60112 was not adequate and now the set of
  // active v7 3dm files has lots of cases with breps that have
  // oversized bounding boxes by the new standard avter Greg's RH-60112 changes.
  // We have already started writing V8 files and those versions of V8
  // have been used by some of our Discourse early adopters.
  // At this point, I'm going to assume a bounding box read from a V7 or V8 file
  // can be too big. By the time V9 rolls around, the boxes should be cleaned up.
  if (file.Archive3dmVersion() < 90 && m_bbox.IsNotEmpty() )
  {
    const ON_BoundingBox archive_brep_bbox = m_bbox;
    ON_BoundingBox new_brep_bbox = ON_BoundingBox::EmptyBoundingBox;
    const unsigned int face_count = m_F.UnsignedCount();
    for (unsigned fi = 0; fi < face_count; ++fi)
    {
      ON_BrepFace& f = this->m_F[fi];
      const ON_BoundingBox archive_face_bbox = f.m_bbox;
      ON_BoundingBox new_face_bbox = f.InternalFaceBoundingBox(false, false);
      f.m_bbox = Internal_BestBoundingBox(archive_face_bbox, new_face_bbox);
      new_brep_bbox.Union(f.m_bbox);
    }
    m_bbox = Internal_BestBoundingBox(archive_brep_bbox, new_brep_bbox);
  }

  return rc;
}